

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O0

void __thiscall
TestClass::SyncFunc6
          (TestClass *this,uint64_t *p1,uint32_t *p2,uint16_t *p3,uint8_t *p4,int64_t *p5,
          int32_t *p6)

{
  SyncEventAgent6<TestClass,_unsigned_long_&,_unsigned_int_&,_unsigned_short_&,_unsigned_char_&,_long_&,_int_&>
  *this_00;
  size_t __n;
  void *__buf;
  SyncEventAgent6<TestClass,_unsigned_long_&,_unsigned_int_&,_unsigned_short_&,_unsigned_char_&,_long_&,_int_&>
  *agent;
  int64_t *p5_local;
  uint8_t *p4_local;
  uint16_t *p3_local;
  uint32_t *p2_local;
  uint64_t *p1_local;
  TestClass *this_local;
  
  this_00 = (SyncEventAgent6<TestClass,_unsigned_long_&,_unsigned_int_&,_unsigned_short_&,_unsigned_char_&,_long_&,_int_&>
             *)operator_new(0x60,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                            ,0xb5);
  __n = 0;
  SyncEventAgent6<TestClass,_unsigned_long_&,_unsigned_int_&,_unsigned_short_&,_unsigned_char_&,_long_&,_int_&>
  ::SyncEventAgent6(this_00,this,0x1103d0,(unsigned_long *)0x0,(uint *)p1,(unsigned_short *)p2,
                    (uchar *)p3,(long *)p4,(int *)p5);
  SyncEventAgent::send((SyncEventAgent *)this_00,(int)this + 8,__buf,__n,(int)p1);
  return;
}

Assistant:

void SyncFunc6(uint64_t &p1, uint32_t &p2, uint16_t &p3, uint8_t &p4,
				   int64_t &p5, int32_t &p6)
	{
		SyncEventAgent6<TestClass, uint64_t &, uint32_t &, uint16_t &, uint8_t &, int64_t &, int32_t &> *agent =
			jh_new SyncEventAgent6<TestClass, uint64_t &, uint32_t &, uint16_t &, uint8_t &, int64_t &, int32_t &>(this, &TestClass::handleSyncFunc6,
			p1, p2, p3, p4, p5, p6);
		agent->send(&mEventThread);
		LOG_INFO("Sync6 result %llu, %u, %u, %u, %lld, %d", p1, p2, p3, p4, p5, p6);
	}